

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int get_physical_cpucount(void)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  reference pvVar4;
  size_t j;
  bool thread_siblings_exists;
  int thread_siblings;
  int i;
  vector<int,_std::allocator<int>_> thread_set;
  int count;
  int in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> *pvVar6;
  int local_24;
  vector<int,_std::allocator<int>_> local_20;
  int local_4;
  
  local_4 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1f95f96);
  local_24 = 0;
  do {
    if (g_cpucount <= local_24) {
      if (local_4 == 0) {
        local_4 = g_cpucount;
      }
      if (g_cpucount < local_4) {
        local_4 = g_cpucount;
      }
      iVar2 = local_4;
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffc0);
      return iVar2;
    }
    iVar2 = get_thread_siblings(in_stack_000000d0);
    if (iVar2 != -1) {
      bVar1 = false;
      pvVar6 = (vector<int,_std::allocator<int>_> *)0x0;
      iVar5 = iVar2;
      while (in_stack_ffffffffffffffc0 = pvVar6,
            pvVar3 = (vector<int,_std::allocator<int>_> *)
                     std::vector<int,_std::allocator<int>_>::size(&local_20), pvVar6 < pvVar3) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_20,(size_type)in_stack_ffffffffffffffc0);
        if (*pvVar4 == iVar2) {
          bVar1 = true;
          break;
        }
        pvVar6 = (vector<int,_std::allocator<int>_> *)
                 ((long)&(in_stack_ffffffffffffffc0->super__Vector_base<int,_std::allocator<int>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
      }
      if (!bVar1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_ffffffffffffffc0,
                   (value_type_conflict1 *)CONCAT44(iVar5,in_stack_ffffffffffffffb8));
        local_4 = local_4 + 1;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static int get_physical_cpucount()
{
    int count = 0;
#if defined _WIN32
    typedef BOOL(WINAPI * LPFN_GLPI)(PSYSTEM_LOGICAL_PROCESSOR_INFORMATION, PDWORD);
    LPFN_GLPI glpi = (LPFN_GLPI)GetProcAddress(GetModuleHandle(TEXT("kernel32")), "GetLogicalProcessorInformation");
    if (glpi == NULL)
    {
        NCNN_LOGE("GetLogicalProcessorInformation is not supported");
        return g_cpucount;
    }

    DWORD return_length = 0;
    glpi(NULL, &return_length);

    PSYSTEM_LOGICAL_PROCESSOR_INFORMATION buffer = (PSYSTEM_LOGICAL_PROCESSOR_INFORMATION)malloc(return_length);
    glpi(buffer, &return_length);

    PSYSTEM_LOGICAL_PROCESSOR_INFORMATION ptr = buffer;
    DWORD byte_offset = 0;
    while (byte_offset + sizeof(SYSTEM_LOGICAL_PROCESSOR_INFORMATION) <= return_length)
    {
        if (ptr->Relationship == RelationProcessorCore)
        {
            count++;
        }

        byte_offset += sizeof(SYSTEM_LOGICAL_PROCESSOR_INFORMATION);
        ptr++;
    }

    free(buffer);
#elif defined __ANDROID__ || defined __linux__
    std::vector<int> thread_set;
    for (int i = 0; i < g_cpucount; i++)
    {
        int thread_siblings = get_thread_siblings(i);
        if (thread_siblings == -1)
        {
            // ignore malformed one
            continue;
        }

        bool thread_siblings_exists = false;
        for (size_t j = 0; j < thread_set.size(); j++)
        {
            if (thread_set[j] == thread_siblings)
            {
                thread_siblings_exists = true;
                break;
            }
        }

        if (!thread_siblings_exists)
        {
            thread_set.push_back(thread_siblings);
            count++;
        }
    }
    if (count == 0)
    {
        // cannot resolve siblings, fallback to all cpu count
        count = g_cpucount;
    }
#elif __APPLE__
    size_t len = sizeof(count);
    sysctlbyname("hw.physicalcpu_max", &count, &len, NULL, 0);
#else
    count = g_cpucount;
#endif

    if (count > g_cpucount)
        count = g_cpucount;

    return count;
}